

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sw_striped_avx2_256_64.c
# Opt level: O1

parasail_result_t *
parasail_sw_striped_profile_avx2_256_64
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap)

{
  __m256i alVar1;
  uint uVar2;
  void *pvVar3;
  parasail_matrix_t *ppVar4;
  uint uVar5;
  bool bVar6;
  __m256i c;
  __m256i *palVar7;
  int iVar8;
  parasail_result_t *result;
  __m256i *b;
  __m256i *palVar9;
  __m256i *palVar10;
  __m256i *b_00;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  __m256i *ptr;
  int iVar17;
  ulong uVar18;
  int iVar19;
  long lVar20;
  ulong uVar21;
  ulong uVar22;
  ulong uVar23;
  ulong uVar24;
  ulong uVar25;
  ulong uVar26;
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [32];
  undefined1 auVar34 [64];
  undefined1 auVar35 [16];
  undefined1 auVar36 [32];
  undefined1 auVar37 [64];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [32];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined8 in_stack_ffffffffffffff08;
  longlong in_stack_ffffffffffffff20;
  ulong uVar60;
  undefined1 auVar30 [64];
  
  if (profile == (parasail_profile_t *)0x0) {
    parasail_sw_striped_profile_avx2_256_64_cold_8();
  }
  else {
    pvVar3 = (profile->profile64).score;
    if (pvVar3 == (void *)0x0) {
      parasail_sw_striped_profile_avx2_256_64_cold_7();
    }
    else {
      ppVar4 = profile->matrix;
      if (ppVar4 == (parasail_matrix_t *)0x0) {
        parasail_sw_striped_profile_avx2_256_64_cold_6();
      }
      else {
        uVar2 = profile->s1Len;
        if ((int)uVar2 < 1) {
          parasail_sw_striped_profile_avx2_256_64_cold_5();
        }
        else if (s2 == (char *)0x0) {
          parasail_sw_striped_profile_avx2_256_64_cold_4();
        }
        else if (s2Len < 1) {
          parasail_sw_striped_profile_avx2_256_64_cold_3();
        }
        else if (open < 0) {
          parasail_sw_striped_profile_avx2_256_64_cold_2();
        }
        else if (gap < 0) {
          parasail_sw_striped_profile_avx2_256_64_cold_1();
        }
        else {
          iVar8 = ppVar4->max;
          result = parasail_result_new();
          if (result != (parasail_result_t *)0x0) {
            uVar23 = (ulong)uVar2 + 3 >> 2;
            result->flag = result->flag | 0x4800804;
            b = parasail_memalign___m256i(0x20,uVar23);
            palVar9 = parasail_memalign___m256i(0x20,uVar23);
            palVar10 = parasail_memalign___m256i(0x20,uVar23);
            b_00 = parasail_memalign___m256i(0x20,uVar23);
            if ((b_00 != (__m256i *)0x0 && palVar10 != (__m256i *)0x0) &&
                (palVar9 != (__m256i *)0x0 && b != (__m256i *)0x0)) {
              auVar27._4_4_ = 0;
              auVar27._0_4_ = open;
              auVar27._8_4_ = open;
              auVar27._12_4_ = 0;
              auVar27._16_4_ = open;
              auVar27._20_4_ = 0;
              auVar27._24_4_ = open;
              auVar27._28_4_ = 0;
              auVar28._4_4_ = 0;
              auVar28._0_4_ = gap;
              auVar28._8_4_ = gap;
              auVar28._12_4_ = 0;
              auVar28._16_4_ = gap;
              auVar28._20_4_ = 0;
              auVar28._24_4_ = gap;
              auVar28._28_4_ = 0;
              alVar1[1] = (longlong)result;
              alVar1[0] = in_stack_ffffffffffffff08;
              alVar1[2] = (longlong)palVar10;
              alVar1[3] = in_stack_ffffffffffffff20;
              parasail_memset___m256i(b,alVar1,uVar23);
              c[1] = (longlong)result;
              c[0] = in_stack_ffffffffffffff08;
              c[2] = (longlong)palVar10;
              c[3] = in_stack_ffffffffffffff20;
              parasail_memset___m256i(b_00,c,uVar23);
              uVar11 = 0;
              uVar5 = (uint)uVar23;
              uVar60 = 0xc000000000000000;
              auVar29._8_8_ = 0xc000000000000000;
              auVar29._0_8_ = 0xc000000000000000;
              auVar29._16_8_ = 0xc000000000000000;
              auVar29._24_8_ = 0xc000000000000000;
              auVar30 = ZEXT3264(auVar29);
              uVar18 = 0;
              auVar34 = ZEXT3264(auVar29);
              do {
                ptr = b;
                iVar19 = ppVar4->mapper[(byte)s2[uVar18]];
                palVar7 = palVar10;
                b = palVar9;
                if ((int)uVar11 == (int)uVar18 + -2) {
                  palVar7 = palVar9;
                  b = palVar10;
                }
                palVar10 = palVar7;
                alVar1 = ptr[uVar5 - 1];
                auVar29 = vperm2i128_avx2((undefined1  [32])alVar1,(undefined1  [32])alVar1,8);
                auVar29 = vpalignr_avx2((undefined1  [32])alVar1,auVar29,8);
                lVar20 = 0;
                auVar37 = ZEXT1664((undefined1  [16])0x0);
                do {
                  auVar29 = vpaddq_avx2(auVar29,*(undefined1 (*) [32])
                                                 ((long)pvVar3 +
                                                 lVar20 + uVar23 * (long)iVar19 * 0x20));
                  uVar14 = *(ulong *)((long)*b_00 + lVar20);
                  if ((long)uVar14 < (long)auVar29._0_8_) {
                    uVar14 = auVar29._0_8_;
                  }
                  uVar21 = *(ulong *)((long)*b_00 + lVar20 + 8);
                  uVar12 = vpextrq_avx(auVar29._0_16_,1);
                  if ((long)uVar21 < (long)uVar12) {
                    uVar21 = uVar12;
                  }
                  uVar12 = *(ulong *)((long)*b_00 + lVar20 + 0x10);
                  if ((long)uVar12 < (long)auVar29._16_8_) {
                    uVar12 = auVar29._16_8_;
                  }
                  uVar25 = *(ulong *)((long)*b_00 + lVar20 + 0x18);
                  uVar13 = vpextrq_avx(auVar29._16_16_,1);
                  if ((long)uVar25 < (long)uVar13) {
                    uVar25 = uVar13;
                  }
                  if ((long)uVar14 <= (long)auVar37._0_8_) {
                    uVar14 = auVar37._0_8_;
                  }
                  uVar13 = vpextrq_avx(auVar37._0_16_,1);
                  if ((long)uVar21 <= (long)uVar13) {
                    uVar21 = uVar13;
                  }
                  if ((long)uVar12 <= (long)auVar37._16_8_) {
                    uVar12 = auVar37._16_8_;
                  }
                  uVar13 = vpextrq_avx(auVar37._16_16_,1);
                  if ((long)uVar25 <= (long)uVar13) {
                    uVar25 = uVar13;
                  }
                  auVar29 = *(undefined1 (*) [32])((long)*b_00 + lVar20);
                  uVar14 = ~((long)uVar14 >> 0x3f) & uVar14;
                  uVar21 = ~((long)uVar21 >> 0x3f) & uVar21;
                  uVar12 = ~((long)uVar12 >> 0x3f) & uVar12;
                  uVar25 = ~((long)uVar25 >> 0x3f) & uVar25;
                  auVar43._8_8_ = 0;
                  auVar43._0_8_ = uVar25;
                  auVar51._8_8_ = 0;
                  auVar51._0_8_ = uVar12;
                  auVar43 = vpunpcklqdq_avx(auVar51,auVar43);
                  auVar52._8_8_ = 0;
                  auVar52._0_8_ = uVar21;
                  auVar57._8_8_ = 0;
                  auVar57._0_8_ = uVar14;
                  auVar51 = vpunpcklqdq_avx(auVar57,auVar52);
                  auVar36._0_16_ = ZEXT116(0) * auVar43 + ZEXT116(1) * auVar51;
                  auVar36._16_16_ =
                       ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar43;
                  *(undefined1 (*) [32])((long)*b + lVar20) = auVar36;
                  uVar13 = auVar34._0_8_;
                  if ((long)auVar34._0_8_ < (long)uVar14) {
                    uVar13 = uVar14;
                  }
                  uVar14 = vpextrq_avx(auVar34._0_16_,1);
                  if ((long)uVar14 < (long)uVar21) {
                    uVar14 = uVar21;
                  }
                  uVar21 = auVar34._16_8_;
                  if ((long)auVar34._16_8_ < (long)uVar12) {
                    uVar21 = uVar12;
                  }
                  uVar12 = vpextrq_avx(auVar34._16_16_,1);
                  if ((long)uVar12 < (long)uVar25) {
                    uVar12 = uVar25;
                  }
                  auVar31._8_8_ = 0;
                  auVar31._0_8_ = uVar12;
                  auVar44._8_8_ = 0;
                  auVar44._0_8_ = uVar21;
                  auVar43 = vpunpcklqdq_avx(auVar44,auVar31);
                  auVar36 = vpsubq_avx2(auVar36,auVar27);
                  auVar29 = vpsubq_avx2(auVar29,auVar28);
                  uVar12 = auVar36._0_8_;
                  uVar21 = auVar29._0_8_;
                  if ((long)auVar29._0_8_ <= (long)uVar12) {
                    uVar21 = uVar12;
                  }
                  uVar25 = vpextrq_avx(auVar29._0_16_,1);
                  uVar22 = vpextrq_avx(auVar36._0_16_,1);
                  if ((long)uVar25 <= (long)uVar22) {
                    uVar25 = uVar22;
                  }
                  uVar26 = auVar36._16_8_;
                  uVar24 = auVar29._16_8_;
                  if ((long)auVar29._16_8_ <= (long)uVar26) {
                    uVar24 = uVar26;
                  }
                  uVar16 = vpextrq_avx(auVar29._16_16_,1);
                  uVar15 = vpextrq_avx(auVar36._16_16_,1);
                  if ((long)uVar16 <= (long)uVar15) {
                    uVar16 = uVar15;
                  }
                  auVar38._8_8_ = 0;
                  auVar38._0_8_ = uVar25;
                  auVar53._8_8_ = 0;
                  auVar53._0_8_ = uVar21;
                  auVar51 = vpunpcklqdq_avx(auVar53,auVar38);
                  auVar54._8_8_ = 0;
                  auVar54._0_8_ = uVar16;
                  auVar58._8_8_ = 0;
                  auVar58._0_8_ = uVar24;
                  auVar52 = vpunpcklqdq_avx(auVar58,auVar54);
                  *(undefined1 (*) [16])((long)*b_00 + lVar20 + 0x10) = auVar52;
                  *(undefined1 (*) [16])((long)*b_00 + lVar20) = auVar51;
                  auVar45._8_8_ = 0;
                  auVar45._0_8_ = uVar14;
                  auVar59._8_8_ = 0;
                  auVar59._0_8_ = uVar13;
                  auVar51 = vpunpcklqdq_avx(auVar59,auVar45);
                  auVar29 = vpsubq_avx2(auVar37._0_32_,auVar28);
                  if ((long)uVar12 < (long)auVar29._0_8_) {
                    uVar12 = auVar29._0_8_;
                  }
                  uVar14 = vpextrq_avx(auVar29._0_16_,1);
                  if ((long)uVar22 < (long)uVar14) {
                    uVar22 = uVar14;
                  }
                  if ((long)uVar26 < (long)auVar29._16_8_) {
                    uVar26 = auVar29._16_8_;
                  }
                  auVar34 = ZEXT3264(CONCAT1616(ZEXT116(1) * auVar43,
                                                ZEXT116(0) * auVar43 + ZEXT116(1) * auVar51));
                  uVar14 = vpextrq_avx(auVar29._16_16_,1);
                  if ((long)uVar15 < (long)uVar14) {
                    uVar15 = uVar14;
                  }
                  auVar35._8_8_ = 0;
                  auVar35._0_8_ = uVar15;
                  auVar39._8_8_ = 0;
                  auVar39._0_8_ = uVar26;
                  auVar43 = vpunpcklqdq_avx(auVar39,auVar35);
                  auVar40._8_8_ = 0;
                  auVar40._0_8_ = uVar22;
                  auVar46._8_8_ = 0;
                  auVar46._0_8_ = uVar12;
                  auVar51 = vpunpcklqdq_avx(auVar46,auVar40);
                  auVar37 = ZEXT3264(CONCAT1616(ZEXT116(1) * auVar43,
                                                ZEXT116(0) * auVar43 + ZEXT116(1) * auVar51));
                  auVar29 = *(undefined1 (*) [32])((long)*ptr + lVar20);
                  lVar20 = lVar20 + 0x20;
                } while (uVar23 << 5 != lVar20);
                iVar19 = 0;
                do {
                  auVar36 = auVar37._0_32_;
                  auVar29 = vperm2i128_avx2(auVar36,auVar36,8);
                  auVar29 = vpalignr_avx2(auVar36,auVar29,8);
                  auVar37 = ZEXT3264(auVar29);
                  lVar20 = 0;
                  do {
                    uVar14 = *(ulong *)((long)*b + lVar20);
                    uVar21 = auVar37._0_8_;
                    if ((long)auVar37._0_8_ < (long)uVar14) {
                      uVar21 = uVar14;
                    }
                    uVar12 = vpextrq_avx(auVar37._0_16_,1);
                    uVar14 = *(ulong *)((long)*b + lVar20 + 8);
                    if ((long)uVar12 < (long)uVar14) {
                      uVar12 = uVar14;
                    }
                    uVar14 = *(ulong *)((long)*b + lVar20 + 0x10);
                    uVar25 = auVar37._16_8_;
                    if ((long)auVar37._16_8_ < (long)uVar14) {
                      uVar25 = uVar14;
                    }
                    uVar13 = vpextrq_avx(auVar37._16_16_,1);
                    uVar14 = *(ulong *)((long)*b + lVar20 + 0x18);
                    if ((long)uVar13 < (long)uVar14) {
                      uVar13 = uVar14;
                    }
                    auVar41._8_8_ = 0;
                    auVar41._0_8_ = uVar13;
                    auVar47._8_8_ = 0;
                    auVar47._0_8_ = uVar25;
                    auVar43 = vpunpcklqdq_avx(auVar47,auVar41);
                    auVar48._8_8_ = 0;
                    auVar48._0_8_ = uVar12;
                    auVar55._8_8_ = 0;
                    auVar55._0_8_ = uVar21;
                    auVar51 = vpunpcklqdq_avx(auVar55,auVar48);
                    auVar42._0_16_ = ZEXT116(0) * auVar43 + ZEXT116(1) * auVar51;
                    auVar42._16_16_ = ZEXT116(1) * auVar43;
                    *(undefined1 (*) [32])((long)*b + lVar20) = auVar42;
                    if ((long)uVar21 <= (long)auVar34._0_8_) {
                      uVar21 = auVar34._0_8_;
                    }
                    uVar14 = vpextrq_avx(auVar34._0_16_,1);
                    if ((long)uVar12 <= (long)uVar14) {
                      uVar12 = uVar14;
                    }
                    if ((long)uVar25 <= (long)auVar34._16_8_) {
                      uVar25 = auVar34._16_8_;
                    }
                    uVar14 = vpextrq_avx(auVar34._16_16_,1);
                    if ((long)uVar13 <= (long)uVar14) {
                      uVar13 = uVar14;
                    }
                    auVar32._8_8_ = 0;
                    auVar32._0_8_ = uVar13;
                    auVar49._8_8_ = 0;
                    auVar49._0_8_ = uVar25;
                    auVar43 = vpunpcklqdq_avx(auVar49,auVar32);
                    auVar50._8_8_ = 0;
                    auVar50._0_8_ = uVar12;
                    auVar56._8_8_ = 0;
                    auVar56._0_8_ = uVar21;
                    auVar51 = vpunpcklqdq_avx(auVar56,auVar50);
                    auVar33._0_16_ = ZEXT116(0) * auVar43 + ZEXT116(1) * auVar51;
                    auVar33._16_16_ = ZEXT116(1) * auVar43;
                    auVar34 = ZEXT3264(auVar33);
                    auVar29 = vpsubq_avx2(auVar42,auVar27);
                    auVar36 = vpsubq_avx2(auVar37._0_32_,auVar28);
                    auVar37 = ZEXT3264(auVar36);
                    auVar29 = vpcmpgtq_avx2(auVar36,auVar29);
                    if ((((auVar29 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                         SUB321(auVar29 >> 0x7f,0) == '\0') && SUB321(auVar29 >> 0xbf,0) == '\0') &&
                        -1 < auVar29[0x1f]) goto LAB_0074cce4;
                    lVar20 = lVar20 + 0x20;
                  } while (uVar23 << 5 != lVar20);
                  iVar19 = iVar19 + 1;
                } while (iVar19 != 4);
LAB_0074cce4:
                auVar29 = vpcmpgtq_avx2(auVar33,auVar30._0_32_);
                bVar6 = true;
                if ((((auVar29 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     SUB321(auVar29 >> 0x7f,0) != '\0') || SUB321(auVar29 >> 0xbf,0) != '\0') ||
                    auVar29[0x1f] < '\0') {
                  if ((long)uVar21 < (long)uVar25) {
                    uVar21 = uVar25;
                  }
                  if ((long)uVar12 < (long)uVar13) {
                    uVar12 = uVar13;
                  }
                  uVar60 = uVar12;
                  if ((long)uVar12 <= (long)uVar21) {
                    uVar60 = uVar21;
                  }
                  if ((long)(~(long)iVar8 + 0x7fffffffffffffffU) < (long)uVar60) {
                    *(byte *)&result->flag = (byte)result->flag | 0x40;
                    bVar6 = false;
                  }
                  else {
                    auVar30 = ZEXT3264(CONCAT824(uVar60,CONCAT816(uVar60,CONCAT88(uVar60,uVar60))));
                    uVar11 = uVar18 & 0xffffffff;
                  }
                }
                iVar19 = (int)uVar18;
                if ((!bVar6) ||
                   (uVar18 = uVar18 + 1, palVar9 = ptr, iVar19 = s2Len, uVar18 == (uint)s2Len)) {
                  if (uVar60 == 0x7fffffffffffffff) {
                    *(byte *)&result->flag = (byte)result->flag | 0x40;
                  }
                  iVar8 = parasail_result_is_saturated(result);
                  palVar9 = palVar10;
                  if (iVar8 == 0) {
                    iVar8 = (int)uVar11;
                    palVar7 = ptr;
                    if (iVar8 == iVar19 + -2) {
                      palVar9 = ptr;
                      palVar7 = palVar10;
                    }
                    if (iVar8 == iVar19 + -1) {
                      palVar9 = b;
                      b = palVar10;
                      palVar7 = ptr;
                    }
                    ptr = palVar7;
                    iVar19 = uVar2 - 1;
                    if (((ulong)uVar2 + 3 & 0x7ffffffc) != 0) {
                      uVar23 = 0;
                      do {
                        if (((*palVar9)[uVar23] == uVar60) &&
                           (iVar17 = ((uint)uVar23 & 3) * uVar5 + ((uint)(uVar23 >> 2) & 0x3fffffff)
                           , iVar17 < iVar19)) {
                          iVar19 = iVar17;
                        }
                        uVar23 = uVar23 + 1;
                      } while ((uVar5 & 0x1fffffff) << 2 != (int)uVar23);
                    }
                    iVar17 = (int)uVar60;
                  }
                  else {
                    iVar8 = 0;
                    iVar17 = -1;
                    iVar19 = 0;
                  }
                  result->score = iVar17;
                  result->end_query = iVar19;
                  result->end_ref = iVar8;
                  parasail_free(b_00);
                  parasail_free(palVar9);
                  parasail_free(ptr);
                  parasail_free(b);
                  return result;
                }
              } while( true );
            }
          }
        }
      }
    }
  }
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    int32_t s1Len = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
#ifdef PARASAIL_ROWCOL
    int32_t offset = 0;
    int32_t position = 0;
#endif
    __m256i* restrict vProfile = NULL;
    __m256i* restrict pvHStore = NULL;
    __m256i* restrict pvHLoad = NULL;
    __m256i* restrict pvHMax = NULL;
    __m256i* restrict pvE = NULL;
    __m256i vGapO;
    __m256i vGapE;
    __m256i vZero;
    __m256i vNegInf;
    int64_t score = 0;
    __m256i vMaxH;
    __m256i vMaxHUnit;
    int64_t maxp = 0;
    /*int64_t stop = 0;*/
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile64.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    k = 0;
    end_query = 0;
    end_ref = 0;
    s1Len = profile->s1Len;
    matrix = profile->matrix;
    segWidth = 4; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
#ifdef PARASAIL_ROWCOL
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
#endif
    vProfile = (__m256i*)profile->profile64.score;
    vGapO = _mm256_set1_epi64x_rpl(open);
    vGapE = _mm256_set1_epi64x_rpl(gap);
    vZero = _mm256_setzero_si256();
    vNegInf = _mm256_set1_epi64x_rpl(NEG_INF);
    score = NEG_INF;
    vMaxH = vNegInf;
    vMaxHUnit = vNegInf;
    maxp = INT64_MAX - (int64_t)(matrix->max+1);
    /*stop = profile->stop == INT32_MAX ?  INT64_MAX : (int64_t)profile->stop;*/

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(segLen*segWidth, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SW | PARASAIL_FLAG_STRIPED
        | PARASAIL_FLAG_BITS_64 | PARASAIL_FLAG_LANES_4;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvHStore = parasail_memalign___m256i(32, segLen);
    pvHLoad =  parasail_memalign___m256i(32, segLen);
    pvHMax = parasail_memalign___m256i(32, segLen);
    pvE = parasail_memalign___m256i(32, segLen);

    /* validate heap variables */
    if (!pvHStore) return NULL;
    if (!pvHLoad) return NULL;
    if (!pvHMax) return NULL;
    if (!pvE) return NULL;

    /* initialize H and E */
    parasail_memset___m256i(pvHStore, vZero, segLen);
    parasail_memset___m256i(pvE, _mm256_set1_epi64x_rpl(-open), segLen);

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m256i vE;
        __m256i vF;
        __m256i vH;
        const __m256i* vP = NULL;
        __m256i* pv = NULL;

        /* Initialize F value to 0.  Any errors to vH values will be
         * corrected in the Lazy_F loop. */
        vF = vZero;

        /* load final segment of pvHStore and shift left by 8 bytes */
        vH = _mm256_load_si256(&pvHStore[segLen - 1]);
        vH = _mm256_slli_si256_rpl(vH, 8);

        /* Correct part of the vProfile */
        vP = vProfile + matrix->mapper[(unsigned char)s2[j]] * segLen;

        if (end_ref == j-2) {
            /* Swap in the max buffer. */
            pv = pvHMax;
            pvHMax = pvHLoad;
            pvHLoad = pvHStore;
            pvHStore = pv;
        }
        else {
            /* Swap the 2 H buffers. */
            pv = pvHLoad;
            pvHLoad = pvHStore;
            pvHStore = pv;
        }

        /* inner loop to process the query sequence */
        for (i=0; i<segLen; ++i) {
            vH = _mm256_add_epi64(vH, _mm256_load_si256(vP + i));
            vE = _mm256_load_si256(pvE + i);

            /* Get max from vH, vE and vF. */
            vH = _mm256_max_epi64_rpl(vH, vE);
            vH = _mm256_max_epi64_rpl(vH, vF);
            vH = _mm256_max_epi64_rpl(vH, vZero);
            /* Save vH values. */
            _mm256_store_si256(pvHStore + i, vH);
#ifdef PARASAIL_TABLE
            arr_store_si256(result->tables->score_table, vH, i, segLen, j, s2Len);
#endif
            vMaxH = _mm256_max_epi64_rpl(vH, vMaxH);

            /* Update vE value. */
            vH = _mm256_sub_epi64(vH, vGapO);
            vE = _mm256_sub_epi64(vE, vGapE);
            vE = _mm256_max_epi64_rpl(vE, vH);
            _mm256_store_si256(pvE + i, vE);

            /* Update vF value. */
            vF = _mm256_sub_epi64(vF, vGapE);
            vF = _mm256_max_epi64_rpl(vF, vH);

            /* Load the next vH. */
            vH = _mm256_load_si256(pvHLoad + i);
        }

        /* Lazy_F loop: has been revised to disallow adjecent insertion and
         * then deletion, so don't update E(i, i), learn from SWPS3 */
        for (k=0; k<segWidth; ++k) {
            vF = _mm256_slli_si256_rpl(vF, 8);
            for (i=0; i<segLen; ++i) {
                vH = _mm256_load_si256(pvHStore + i);
                vH = _mm256_max_epi64_rpl(vH,vF);
                _mm256_store_si256(pvHStore + i, vH);
#ifdef PARASAIL_TABLE
                arr_store_si256(result->tables->score_table, vH, i, segLen, j, s2Len);
#endif
                vMaxH = _mm256_max_epi64_rpl(vH, vMaxH);
                vH = _mm256_sub_epi64(vH, vGapO);
                vF = _mm256_sub_epi64(vF, vGapE);
                if (! _mm256_movemask_epi8(_mm256_cmpgt_epi64(vF, vH))) goto end;
                /*vF = _mm256_max_epi64_rpl(vF, vH);*/
            }
        }
end:
        {
        }

#ifdef PARASAIL_ROWCOL
        /* extract last value from the column */
        {
            vH = _mm256_load_si256(pvHStore + offset);
            for (k=0; k<position; ++k) {
                vH = _mm256_slli_si256_rpl(vH, 8);
            }
            result->rowcols->score_row[j] = (int64_t) _mm256_extract_epi64_rpl (vH, 3);
        }
#endif

        {
            __m256i vCompare = _mm256_cmpgt_epi64(vMaxH, vMaxHUnit);
            if (_mm256_movemask_epi8(vCompare)) {
                score = _mm256_hmax_epi64_rpl(vMaxH);
                /* if score has potential to overflow, abort early */
                if (score > maxp) {
                    result->flag |= PARASAIL_FLAG_SATURATED;
                    break;
                }
                vMaxHUnit = _mm256_set1_epi64x_rpl(score);
                end_ref = j;
            }
        }

        /*if (score == stop) break;*/
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m256i vH = _mm256_load_si256(pvHStore+i);
        arr_store_col(result->rowcols->score_col, vH, i, segLen);
    }
#endif

    if (score == INT64_MAX) {
        result->flag |= PARASAIL_FLAG_SATURATED;
    }

    if (parasail_result_is_saturated(result)) {
        score = INT64_MAX;
        end_query = 0;
        end_ref = 0;
    }
    else {
        if (end_ref == j-1) {
            /* end_ref was the last store column */
            __m256i *pv = pvHMax;
            pvHMax = pvHStore;
            pvHStore = pv;
        }
        else if (end_ref == j-2) {
            /* end_ref was the last load column */
            __m256i *pv = pvHMax;
            pvHMax = pvHLoad;
            pvHLoad = pv;
        }
        /* Trace the alignment ending position on read. */
        {
            int64_t *t = (int64_t*)pvHMax;
            int32_t column_len = segLen * segWidth;
            end_query = s1Len - 1;
            for (i = 0; i<column_len; ++i, ++t) {
                if (*t == score) {
                    int32_t temp = i / segWidth + i % segWidth * segLen;
                    if (temp < end_query) {
                        end_query = temp;
                    }
                }
            }
        }
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(pvE);
    parasail_free(pvHMax);
    parasail_free(pvHLoad);
    parasail_free(pvHStore);

    return result;
}